

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_std_suite.cpp
# Opt level: O1

void set_suite::run(void)

{
  test_int_empty();
  test_int_one();
  test_int_two();
  fail_missing_begin();
  fail_missing_end();
  fail_missing_count();
  return;
}

Assistant:

void run()
{
    test_int_empty();
    test_int_one();
    test_int_two();
    fail_missing_begin();
    fail_missing_end();
    fail_missing_count();
}